

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

int quicly_decode_datagram_frame
              (uint64_t frame_type,uint8_t **src,uint8_t *end,quicly_datagram_frame_t *frame)

{
  uint64_t uVar1;
  undefined8 *in_RCX;
  uint8_t *in_RDX;
  uint8_t **in_RSI;
  long in_RDI;
  uint64_t len;
  
  if (in_RDI == 0x31) {
    uVar1 = ptls_decode_quicint(in_RSI,in_RDX);
    if ((uVar1 == 0xffffffffffffffff) || ((ulong)((long)in_RDX - (long)*in_RSI) < uVar1)) {
      return 0x20007;
    }
    in_RCX[1] = uVar1;
  }
  else {
    in_RCX[1] = (long)in_RDX - (long)*in_RSI;
  }
  *in_RCX = *in_RSI;
  *in_RSI = *in_RSI + in_RCX[1];
  return 0;
}

Assistant:

inline int quicly_decode_datagram_frame(uint64_t frame_type, const uint8_t **src, const uint8_t *end,
                                        quicly_datagram_frame_t *frame)
{
    if (frame_type == QUICLY_FRAME_TYPE_DATAGRAM_WITHLEN) {
        uint64_t len;
        if ((len = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        if ((uint64_t)(end - *src) < len)
            goto Error;
        frame->payload.len = len;
    } else {
        frame->payload.len = end - *src;
    }
    frame->payload.base = (uint8_t *)*src;
    *src += frame->payload.len;
    return 0;
Error:
    return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;
}